

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void mpt_drange(double *range,int len,double *val,int ld)

{
  undefined4 uVar1;
  undefined4 uVar2;
  double dVar3;
  double dVar4;
  
  if (len == 0) {
    *range = 0.0;
    range[1] = 0.0;
    return;
  }
  dVar3 = *val;
  uVar1 = SUB84(dVar3,0);
  uVar2 = (undefined4)((ulong)dVar3 >> 0x20);
  range[1] = dVar3;
  *range = dVar3;
  if (ld != 0) {
    while (1 < len) {
      dVar4 = val[ld];
      if (dVar4 < dVar3) {
        *range = dVar4;
        dVar3 = dVar4;
        dVar4 = val[ld];
      }
      len = len + -1;
      val = val + ld;
      if ((double)CONCAT44(uVar2,uVar1) <= dVar4 && dVar4 != (double)CONCAT44(uVar2,uVar1)) {
        range[1] = dVar4;
        uVar1 = SUB84(dVar4,0);
        uVar2 = (undefined4)((ulong)dVar4 >> 0x20);
      }
    }
  }
  return;
}

Assistant:

extern void MPT_RANGE_FCN(MPT_RANGE_T range[2], int len, const MPT_RANGE_T *val, int ld)
{
	if (!len) {
#ifdef __cplusplus
		range[0] = range[1] = MPT_RANGE_T();
#else
		range[0] = range[1] = 0;
#endif
		return;
	}
	range[0] = range[1] = *val;
	
	if (!ld) {
		return;
	}
	while (--len > 0) {
		val += ld;
		if (*val < range[0]) {
			range[0] = *val;
		}
		if (*val > range[1]) {
			range[1] = *val;
		}
	}
}